

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsSat.c
# Opt level: O3

int Abc_NtkMfsSolveSat_iter(Mfs_Man_t *p)

{
  int iVar1;
  long lVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  ABC_INT64_T nConfLimit;
  sat_solver *psVar7;
  ulong uVar8;
  int Lits [12];
  uint local_38 [12];
  
  iVar5 = p->nTotConfLim;
  if ((long)iVar5 == 0) {
    psVar7 = p->pSat;
    nConfLimit = 0;
  }
  else {
    psVar7 = p->pSat;
    lVar2 = (psVar7->stats).conflicts;
    if (iVar5 <= lVar2) {
      return -1;
    }
    nConfLimit = (ABC_INT64_T)(iVar5 - (int)lVar2);
  }
  iVar5 = sat_solver_solve(psVar7,(lit *)0x0,(lit *)0x0,nConfLimit,0,0,0);
  if (iVar5 + 1U < 3) {
    if (iVar5 == 0) {
      uVar6 = 0xffffffff;
    }
    else if (iVar5 == -1) {
      uVar6 = 0;
    }
    else {
      p->nCares = p->nCares + 1;
      pVVar3 = p->vProjVarsSat;
      iVar5 = pVVar3->nSize;
      if ((long)iVar5 < 1) {
        uVar6 = 0;
      }
      else {
        piVar4 = pVVar3->pArray;
        psVar7 = p->pSat;
        uVar8 = 0;
        uVar6 = 0;
        do {
          iVar1 = piVar4[uVar8];
          local_38[uVar8] = iVar1 * 2;
          if (((long)iVar1 < 0) || (psVar7->size <= iVar1)) {
            __assert_fail("v >= 0 && v < s->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                          ,0xda,"int sat_solver_var_value(sat_solver *, int)");
          }
          if (psVar7->model[iVar1] == 1) {
            uVar6 = uVar6 | 1 << ((uint)uVar8 & 0x1f);
            local_38[uVar8] = iVar1 * 2 | 1;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < (ulong)(long)iVar5);
      }
      if ((p->uCare[(int)uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0) {
        __assert_fail("!Abc_InfoHasBit(p->uCare, Mint)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/mfs/mfsSat.c"
                      ,0x4b,"int Abc_NtkMfsSolveSat_iter(Mfs_Man_t *)");
      }
      p->uCare[(int)uVar6 >> 5] = p->uCare[(int)uVar6 >> 5] | 1 << ((byte)uVar6 & 0x1f);
      iVar5 = sat_solver_addclause(p->pSat,(lit *)local_38,(lit *)(local_38 + pVVar3->nSize));
      uVar6 = (uint)(iVar5 != 0);
    }
    return uVar6;
  }
  __assert_fail("RetValue == l_Undef || RetValue == l_True || RetValue == l_False",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/mfs/mfsSat.c"
                ,0x36,"int Abc_NtkMfsSolveSat_iter(Mfs_Man_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Enumerates through the SAT assignments.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Abc_NtkMfsSolveSat_iter( Mfs_Man_t * p )
{
    int Lits[MFS_FANIN_MAX];
    int RetValue, nBTLimit, iVar, b, Mint;
//    int nConfs = p->pSat->stats.conflicts;
    if ( p->nTotConfLim && p->nTotConfLim <= p->pSat->stats.conflicts )
        return -1;
    nBTLimit = p->nTotConfLim? p->nTotConfLim - p->pSat->stats.conflicts : 0;
    RetValue = sat_solver_solve( p->pSat, NULL, NULL, (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    assert( RetValue == l_Undef || RetValue == l_True || RetValue == l_False );
//printf( "%c", RetValue==l_Undef ? '?' : (RetValue==l_False ? '-' : '+') );
//printf( "%d ", p->pSat->stats.conflicts-nConfs );
//if ( RetValue==l_False )
//printf( "\n" );
    if ( RetValue == l_Undef )
        return -1;
    if ( RetValue == l_False )
        return 0;
    p->nCares++;
    // add SAT assignment to the solver
    Mint = 0;
    Vec_IntForEachEntry( p->vProjVarsSat, iVar, b )
    {
        Lits[b] = toLit( iVar );
        if ( sat_solver_var_value( p->pSat, iVar ) )
        {
            Mint |= (1 << b);
            Lits[b] = lit_neg( Lits[b] );
        }
    }
    assert( !Abc_InfoHasBit(p->uCare, Mint) );
    Abc_InfoSetBit( p->uCare, Mint );
    // add the blocking clause
    RetValue = sat_solver_addclause( p->pSat, Lits, Lits + Vec_IntSize(p->vProjVarsSat) );
    if ( RetValue == 0 )
        return 0;
    return 1;
}